

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# epoch_tracker.cc
# Opt level: O0

bool __thiscall
sptk::reaper::EpochTracker::ResampleAndReturnResults
          (EpochTracker *this,float resample_interval,vector<float,_std::allocator<float>_> *f0,
          vector<float,_std::allocator<float>_> *correlations)

{
  const_iterator __position;
  const_iterator __position_00;
  int32_t iVar1;
  int iVar2;
  int32_t iVar3;
  size_type sVar4;
  reference pvVar5;
  reference pvVar6;
  vector<float,_std::allocator<float>_> *in_RDX;
  vector<float,_std::allocator<float>_> *in_RSI;
  size_type in_RDI;
  float in_XMM0_Da;
  int32_t frame_1;
  int32_t fr;
  int32_t frame;
  int32_t i;
  float prev_corr;
  float prev_f0;
  int32_t prev_frame;
  int32_t limit;
  int32_t n_frames;
  float last_time;
  vector<float,_std::allocator<float>_> *in_stack_ffffffffffffff38;
  undefined4 in_stack_ffffffffffffff40;
  float fVar7;
  undefined4 in_stack_ffffffffffffff44;
  size_type in_stack_ffffffffffffff58;
  vector<float,_std::allocator<float>_> *in_stack_ffffffffffffff60;
  vector<float,_std::allocator<float>_> *__x;
  undefined4 in_stack_ffffffffffffff70;
  undefined4 in_stack_ffffffffffffff74;
  undefined4 in_stack_ffffffffffffff78;
  undefined4 in_stack_ffffffffffffff7c;
  float local_80;
  float local_7c;
  int local_78;
  bool local_1;
  
  if ((*(float *)(in_RDI + 0x128) <= 0.0) ||
     (sVar4 = std::
              vector<sptk::reaper::EpochTracker::TrackerResults,_std::allocator<sptk::reaper::EpochTracker::TrackerResults>_>
              ::size((vector<sptk::reaper::EpochTracker::TrackerResults,_std::allocator<sptk::reaper::EpochTracker::TrackerResults>_>
                      *)(in_RDI + 0x20)), sVar4 == 0)) {
    fprintf(_stderr,"Un-initialized EpochTracker or no output_ in ResampleAndReturnF0\n");
    local_1 = false;
  }
  else if (0.0 < in_XMM0_Da) {
    pvVar5 = std::
             vector<sptk::reaper::EpochTracker::TrackerResults,_std::allocator<sptk::reaper::EpochTracker::TrackerResults>_>
             ::operator[]((vector<sptk::reaper::EpochTracker::TrackerResults,_std::allocator<sptk::reaper::EpochTracker::TrackerResults>_>
                           *)(in_RDI + 0x20),0);
    iVar1 = RoundUp(((float)pvVar5->resid_index / *(float *)(in_RDI + 0x128) +
                    *(float *)(in_RDI + 0x1f0)) / in_XMM0_Da);
    std::vector<float,_std::allocator<float>_>::resize
              (in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
    std::vector<float,_std::allocator<float>_>::resize
              (in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
    std::vector<float,_std::allocator<float>_>::begin(in_stack_ffffffffffffff38);
    __gnu_cxx::__normal_iterator<float_const*,std::vector<float,std::allocator<float>>>::
    __normal_iterator<float*>
              ((__normal_iterator<const_float_*,_std::vector<float,_std::allocator<float>_>_> *)
               CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),
               (__normal_iterator<float_*,_std::vector<float,_std::allocator<float>_>_> *)
               in_stack_ffffffffffffff38);
    __position._M_current._4_4_ = in_stack_ffffffffffffff7c;
    __position._M_current._0_4_ = in_stack_ffffffffffffff78;
    std::vector<float,_std::allocator<float>_>::insert
              ((vector<float,_std::allocator<float>_> *)
               CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),__position,in_RDI,
               (value_type_conflict2 *)in_stack_ffffffffffffff60);
    __x = in_RDX;
    std::vector<float,_std::allocator<float>_>::begin(in_stack_ffffffffffffff38);
    __gnu_cxx::__normal_iterator<float_const*,std::vector<float,std::allocator<float>>>::
    __normal_iterator<float*>
              ((__normal_iterator<const_float_*,_std::vector<float,_std::allocator<float>_>_> *)
               CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),
               (__normal_iterator<float_*,_std::vector<float,_std::allocator<float>_>_> *)
               in_stack_ffffffffffffff38);
    __position_00._M_current._4_4_ = in_stack_ffffffffffffff7c;
    __position_00._M_current._0_4_ = in_stack_ffffffffffffff78;
    std::vector<float,_std::allocator<float>_>::insert
              ((vector<float,_std::allocator<float>_> *)
               CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),__position_00,in_RDI,
               (value_type_conflict2 *)__x);
    sVar4 = std::
            vector<sptk::reaper::EpochTracker::TrackerResults,_std::allocator<sptk::reaper::EpochTracker::TrackerResults>_>
            ::size((vector<sptk::reaper::EpochTracker::TrackerResults,_std::allocator<sptk::reaper::EpochTracker::TrackerResults>_>
                    *)(in_RDI + 0x20));
    iVar2 = (int)sVar4 + -1;
    local_78 = 0;
    pvVar5 = std::
             vector<sptk::reaper::EpochTracker::TrackerResults,_std::allocator<sptk::reaper::EpochTracker::TrackerResults>_>
             ::operator[]((vector<sptk::reaper::EpochTracker::TrackerResults,_std::allocator<sptk::reaper::EpochTracker::TrackerResults>_>
                           *)(in_RDI + 0x20),(long)iVar2);
    local_7c = pvVar5->f0;
    pvVar5 = std::
             vector<sptk::reaper::EpochTracker::TrackerResults,_std::allocator<sptk::reaper::EpochTracker::TrackerResults>_>
             ::operator[]((vector<sptk::reaper::EpochTracker::TrackerResults,_std::allocator<sptk::reaper::EpochTracker::TrackerResults>_>
                           *)(in_RDI + 0x20),(long)iVar2);
    local_80 = pvVar5->nccf_value;
    for (; -1 < iVar2; iVar2 = iVar2 + -1) {
      pvVar5 = std::
               vector<sptk::reaper::EpochTracker::TrackerResults,_std::allocator<sptk::reaper::EpochTracker::TrackerResults>_>
               ::operator[]((vector<sptk::reaper::EpochTracker::TrackerResults,_std::allocator<sptk::reaper::EpochTracker::TrackerResults>_>
                             *)(in_RDI + 0x20),(long)iVar2);
      iVar3 = RoundUp((float)pvVar5->resid_index / (*(float *)(in_RDI + 0x128) * in_XMM0_Da));
      if (iVar1 <= iVar3) {
        iVar3 = iVar1 + -1;
      }
      pvVar5 = std::
               vector<sptk::reaper::EpochTracker::TrackerResults,_std::allocator<sptk::reaper::EpochTracker::TrackerResults>_>
               ::operator[]((vector<sptk::reaper::EpochTracker::TrackerResults,_std::allocator<sptk::reaper::EpochTracker::TrackerResults>_>
                             *)(in_RDI + 0x20),(long)iVar2);
      fVar7 = pvVar5->f0;
      pvVar6 = std::vector<float,_std::allocator<float>_>::operator[](in_RSI,(long)iVar3);
      *pvVar6 = fVar7;
      pvVar5 = std::
               vector<sptk::reaper::EpochTracker::TrackerResults,_std::allocator<sptk::reaper::EpochTracker::TrackerResults>_>
               ::operator[]((vector<sptk::reaper::EpochTracker::TrackerResults,_std::allocator<sptk::reaper::EpochTracker::TrackerResults>_>
                             *)(in_RDI + 0x20),(long)iVar2);
      fVar7 = pvVar5->nccf_value;
      pvVar6 = std::vector<float,_std::allocator<float>_>::operator[](in_RDX,(long)iVar3);
      *pvVar6 = fVar7;
      if (1 < iVar3 - local_78) {
        while (local_78 = local_78 + 1, local_78 < iVar3) {
          pvVar6 = std::vector<float,_std::allocator<float>_>::operator[](in_RSI,(long)local_78);
          *pvVar6 = local_7c;
          pvVar6 = std::vector<float,_std::allocator<float>_>::operator[](in_RDX,(long)local_78);
          *pvVar6 = local_80;
        }
      }
      pvVar5 = std::
               vector<sptk::reaper::EpochTracker::TrackerResults,_std::allocator<sptk::reaper::EpochTracker::TrackerResults>_>
               ::operator[]((vector<sptk::reaper::EpochTracker::TrackerResults,_std::allocator<sptk::reaper::EpochTracker::TrackerResults>_>
                             *)(in_RDI + 0x20),(long)iVar2);
      local_80 = pvVar5->nccf_value;
      pvVar5 = std::
               vector<sptk::reaper::EpochTracker::TrackerResults,_std::allocator<sptk::reaper::EpochTracker::TrackerResults>_>
               ::operator[]((vector<sptk::reaper::EpochTracker::TrackerResults,_std::allocator<sptk::reaper::EpochTracker::TrackerResults>_>
                             *)(in_RDI + 0x20),(long)iVar2);
      local_7c = pvVar5->f0;
      local_78 = iVar3;
    }
    for (; local_78 < iVar1; local_78 = local_78 + 1) {
      fVar7 = local_7c;
      pvVar6 = std::vector<float,_std::allocator<float>_>::operator[](in_RSI,(long)local_78);
      *pvVar6 = fVar7;
      fVar7 = local_80;
      pvVar6 = std::vector<float,_std::allocator<float>_>::operator[](in_RDX,(long)local_78);
      *pvVar6 = fVar7;
    }
    local_1 = true;
  }
  else {
    fprintf(_stderr,"resample_interval <= 0.0 in ResampleAndReturnF0\n");
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool EpochTracker::ResampleAndReturnResults(float resample_interval,
                                            std::vector<float>* f0,
                                            std::vector<float>* correlations) {
  if ((sample_rate_ <= 0.0) || (output_.size() == 0)) {
    fprintf(stderr, 
            "Un-initialized EpochTracker or no output_ in ResampleAndReturnF0\n");
    return false;
  }
  if (resample_interval <= 0.0) {
    fprintf(stderr, "resample_interval <= 0.0 in ResampleAndReturnF0\n");
    return false;
  }
  float last_time = (output_[0].resid_index / sample_rate_) + endpoint_padding_;
  int32_t n_frames = RoundUp(last_time / resample_interval);
  f0->resize(0);
  correlations->resize(0);
  f0->insert(f0->begin(), n_frames, 0.0);
  correlations->insert(correlations->begin(), n_frames, 0.0);
  int32_t limit = output_.size() - 1;
  int32_t prev_frame = 0;
  float prev_f0 = output_[limit].f0;
  float prev_corr = output_[limit].nccf_value;
  for (int32_t i = limit; i >= 0; --i) {
    int32_t frame = RoundUp(output_[i].resid_index /
                            (sample_rate_ * resample_interval));
#if 1
    if (frame >= n_frames) {
      frame = n_frames - 1;
    }
#endif
    (*f0)[frame] = output_[i].f0;
    (*correlations)[frame] = output_[i].nccf_value;
    if ((frame - prev_frame) > 1) {
      for (int32_t fr = prev_frame + 1; fr < frame; ++fr) {
        (*f0)[fr] = prev_f0;
        (*correlations)[fr] = prev_corr;
      }
    }
    prev_frame = frame;
    prev_corr = output_[i].nccf_value;
    prev_f0 = output_[i].f0;
  }
  for (int32_t frame = prev_frame; frame < n_frames; ++frame) {
    (*f0)[frame] = prev_f0;
    (*correlations)[frame] = prev_corr;
  }
  return true;
}